

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

void __thiscall vk::BinaryRegistryDetail::BinaryIndexHash::BinaryIndexHash(BinaryIndexHash *this)

{
  deMemPool *pool;
  BinaryIndexHashImpl *pBVar1;
  bad_alloc *this_00;
  BinaryIndexHash *this_local;
  
  de::MemPool::MemPool(&this->m_memPool,(deMemPoolUtil *)0x0,0);
  pool = de::MemPool::getRawPool(&this->m_memPool);
  pBVar1 = BinaryIndexHashImpl_create(pool);
  this->m_hash = pBVar1;
  if (this->m_hash == (BinaryIndexHashImpl *)0x0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return;
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}